

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O3

void fidentity16x16_new_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  undefined1 auVar1 [32];
  long lVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  
  lVar2 = 0;
  auVar3._8_2_ = 1;
  auVar3._0_8_ = 0x1000100010001;
  auVar3._10_2_ = 1;
  auVar3._12_2_ = 1;
  auVar3._14_2_ = 1;
  auVar3._16_2_ = 1;
  auVar3._18_2_ = 1;
  auVar3._20_2_ = 1;
  auVar3._22_2_ = 1;
  auVar3._24_2_ = 1;
  auVar3._26_2_ = 1;
  auVar3._28_2_ = 1;
  auVar3._30_2_ = 1;
  auVar4._8_4_ = 0x8002d42;
  auVar4._0_8_ = 0x8002d4208002d42;
  auVar4._12_4_ = 0x8002d42;
  auVar4._16_4_ = 0x8002d42;
  auVar4._20_4_ = 0x8002d42;
  auVar4._24_4_ = 0x8002d42;
  auVar4._28_4_ = 0x8002d42;
  do {
    auVar5 = *(undefined1 (*) [32])((long)*input + lVar2);
    auVar6 = vpunpcklwd_avx2(auVar5,auVar3);
    auVar1 = vpunpckhwd_avx2(auVar5,auVar3);
    auVar5 = vpmaddwd_avx2(auVar6,auVar4);
    auVar6 = vpsrad_avx2(auVar5,0xc);
    auVar5 = vpmaddwd_avx2(auVar1,auVar4);
    auVar5 = vpsrad_avx2(auVar5,0xc);
    auVar5 = vpackssdw_avx2(auVar6,auVar5);
    *(undefined1 (*) [32])((long)*output + lVar2) = auVar5;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x200);
  return;
}

Assistant:

static inline void fidentity16x16_new_avx2(const __m256i *input,
                                           __m256i *output, int8_t cos_bit) {
  (void)cos_bit;
  const __m256i one = _mm256_set1_epi16(1);

  for (int i = 0; i < 16; ++i) {
    const __m256i a_lo = _mm256_unpacklo_epi16(input[i], one);
    const __m256i a_hi = _mm256_unpackhi_epi16(input[i], one);
    const __m256i b_lo = scale_round_avx2(a_lo, 2 * NewSqrt2);
    const __m256i b_hi = scale_round_avx2(a_hi, 2 * NewSqrt2);
    output[i] = _mm256_packs_epi32(b_lo, b_hi);
  }
}